

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O2

GLubyte * glewGetString(GLenum name)

{
  ulong uVar1;
  
  uVar1 = 0;
  if (name < 5) {
    uVar1 = (ulong)name;
  }
  return glewGetString::_glewString[uVar1];
}

Assistant:

const GLubyte * GLEWAPIENTRY glewGetString (GLenum name)
{
  static const GLubyte* _glewString[] =
  {
    (const GLubyte*)NULL,
    (const GLubyte*)"2.1.0",
    (const GLubyte*)"2",
    (const GLubyte*)"1",
    (const GLubyte*)"0"
  };
  const size_t max_string = sizeof(_glewString)/sizeof(*_glewString) - 1;
  return _glewString[(size_t)name > max_string ? 0 : (size_t)name];
}